

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

void testQueue(void)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  ostream *poVar4;
  int x_1;
  uint local_138;
  int local_134;
  int x;
  int i;
  Queue_t queue;
  
  guts::BinomialQueue<int>::BinomialQueue((BinomialQueue<int> *)&x);
  for (local_134 = 0; local_134 != 100; local_134 = local_134 + 1) {
    uVar2 = rand32();
    local_138 = uVar2 % 0x61;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_138);
    std::operator<<(poVar4,' ');
    guts::BinomialQueue<int>::push((BinomialQueue<int> *)&x,(int *)&local_138);
  }
  guts::BinomialQueue<int>::decrease_key((BinomialQueue<int> *)&x,0,0);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  while( true ) {
    bVar1 = guts::BinomialQueue<int>::empty((BinomialQueue<int> *)&x);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    iVar3 = guts::BinomialQueue<int>::pop((BinomialQueue<int> *)&x);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::operator<<(poVar4,' ');
  }
  guts::BinomialQueue<int>::~BinomialQueue((BinomialQueue<int> *)&x);
  return;
}

Assistant:

void testQueue()
{
    Queue_t queue;

    for (int i = 0; i != 100; ++i)
    {

        int x = rand32() % 97; 
        
        std::cout << x << ' ';

        queue.push(x);
    }

    queue.decrease_key(0, 0);

    std::cout << std::endl;

    while (!queue.empty())
    {
        int x = queue.pop();

        std::cout << x << ' ';
    }
}